

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Quat4f * __thiscall Quat4f::operator=(Quat4f *this,Quat4f *rq)

{
  if (this != rq) {
    this->m_elements[0] = rq->m_elements[0];
    this->m_elements[1] = rq->m_elements[1];
    this->m_elements[2] = rq->m_elements[2];
    this->m_elements[3] = rq->m_elements[3];
  }
  return this;
}

Assistant:

Quat4f& Quat4f::operator = ( const Quat4f& rq )
{
	if( this != ( &rq ) )
	{
		m_elements[ 0 ] = rq.m_elements[ 0 ];
		m_elements[ 1 ] = rq.m_elements[ 1 ];
		m_elements[ 2 ] = rq.m_elements[ 2 ];
		m_elements[ 3 ] = rq.m_elements[ 3 ];
	}
    return( *this );
}